

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSExportEntry * find_export_entry(JSContext *ctx,JSModuleDef *m,JSAtom export_name)

{
  int i;
  JSExportEntry *me;
  JSAtom export_name_local;
  JSModuleDef *m_local;
  JSContext *ctx_local;
  
  i = 0;
  while( true ) {
    if (m->export_entries_count <= i) {
      return (JSExportEntry *)0x0;
    }
    if (m->export_entries[i].export_name == export_name) break;
    i = i + 1;
  }
  return m->export_entries + i;
}

Assistant:

static JSExportEntry *find_export_entry(JSContext *ctx, JSModuleDef *m,
                                        JSAtom export_name)
{
    JSExportEntry *me;
    int i;
    for(i = 0; i < m->export_entries_count; i++) {
        me = &m->export_entries[i];
        if (me->export_name == export_name)
            return me;
    }
    return NULL;
}